

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerHLSL::write_access_chain_value_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,uint32_t value,
          SmallVector<unsigned_int,_8UL> *composite_chain,bool enclose)

{
  uint32_t base;
  bool bVar1;
  uint *indices;
  size_t sVar2;
  string local_b0;
  string local_90;
  undefined1 local_6c [8];
  AccessChainMeta meta;
  string local_50;
  undefined1 local_2a;
  byte local_29;
  SmallVector<unsigned_int,_8UL> *pSStack_28;
  bool enclose_local;
  SmallVector<unsigned_int,_8UL> *composite_chain_local;
  CompilerHLSL *pCStack_18;
  uint32_t value_local;
  CompilerHLSL *this_local;
  string *ret;
  
  local_2a = 0;
  local_29 = enclose;
  pSStack_28 = composite_chain;
  composite_chain_local._4_4_ = value;
  pCStack_18 = this;
  this_local = (CompilerHLSL *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = VectorView<unsigned_int>::empty(&pSStack_28->super_VectorView<unsigned_int>);
  if (bVar1) {
    CompilerGLSL::to_expression_abi_cxx11_
              (&local_50,&this->super_CompilerGLSL,composite_chain_local._4_4_,true);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    AccessChainMeta::AccessChainMeta((AccessChainMeta *)local_6c);
    base = composite_chain_local._4_4_;
    indices = VectorView<unsigned_int>::data(&pSStack_28->super_VectorView<unsigned_int>);
    sVar2 = VectorView<unsigned_int>::size(&pSStack_28->super_VectorView<unsigned_int>);
    CompilerGLSL::access_chain_internal_abi_cxx11_
              (&local_90,&this->super_CompilerGLSL,base,indices,(uint32_t)sVar2,0x11,
               (AccessChainMeta *)local_6c);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
  }
  if ((local_29 & 1) != 0) {
    CompilerGLSL::enclose_expression(&local_b0,&this->super_CompilerGLSL,__return_storage_ptr__);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::write_access_chain_value(uint32_t value, const SmallVector<uint32_t> &composite_chain,
                                              bool enclose)
{
	string ret;
	if (composite_chain.empty())
		ret = to_expression(value);
	else
	{
		AccessChainMeta meta;
		ret = access_chain_internal(value, composite_chain.data(), uint32_t(composite_chain.size()),
		                            ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_LITERAL_MSB_FORCE_ID, &meta);
	}

	if (enclose)
		ret = enclose_expression(ret);
	return ret;
}